

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::ReorderingBuffer::append
          (ReorderingBuffer *this,UChar *s,int32_t length,UBool isNFD,uint8_t leadCC,uint8_t trailCC
          ,UErrorCode *errorCode)

{
  int iVar1;
  Normalizer2Impl *this_00;
  UBool UVar2;
  uint16_t uVar3;
  uint8_t cc;
  UChar *pUVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  
  if (length == 0) {
    return '\x01';
  }
  if ((this->remainingCapacity < length) && (UVar2 = resize(this,length,errorCode), UVar2 == '\0'))
  {
    return '\0';
  }
  this->remainingCapacity = this->remainingCapacity - length;
  if ((leadCC != '\0') && (leadCC < this->lastCC)) {
    uVar7 = (uint)(ushort)*s;
    iVar6 = 1;
    if ((length != 1 && (uVar7 & 0xfc00) == 0xd800) && (((ushort)s[1] & 0xfc00) == 0xdc00)) {
      uVar7 = (uint)(ushort)*s * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
      iVar6 = 2;
    }
    insert(this,uVar7,leadCC);
    while (iVar6 < length) {
      iVar1 = iVar6 + 1;
      uVar7 = (uint)(ushort)s[iVar6];
      if ((iVar1 != length && (uVar7 & 0xfc00) == 0xd800) && (((ushort)s[iVar1] & 0xfc00) == 0xdc00)
         ) {
        uVar7 = (uint)(ushort)s[iVar6] * 0x400 + (uint)(ushort)s[iVar1] + 0xfca02400;
        iVar1 = iVar6 + 2;
      }
      iVar6 = iVar1;
      cc = trailCC;
      if (iVar6 < length) {
        this_00 = this->impl;
        if (isNFD == '\0') {
          uVar3 = Normalizer2Impl::getNorm16(this_00,uVar7);
          if (uVar3 < 0xfc00) {
            cc = '\0';
            if ((this_00->minNoNo <= uVar3) && (uVar3 < this_00->limitNoNo)) {
              if ((*(byte *)((long)this_00->extraData + (ulong)(uVar3 & 0xfffe)) & 0x80) == 0) {
                cc = '\0';
              }
              else {
                cc = (uint8_t)this_00->extraData[(ulong)(uVar3 >> 1) - 1];
              }
            }
          }
          else {
            cc = (uint8_t)(uVar3 >> 1);
          }
        }
        else {
          uVar3 = Normalizer2Impl::getRawNorm16(this_00,uVar7);
          cc = (uint8_t)(uVar3 >> 1);
          if (uVar3 < 0xfc00) {
            cc = '\0';
          }
        }
      }
      append(this,uVar7,cc,errorCode);
    }
    return '\x01';
  }
  if (trailCC < 2) {
    pUVar4 = this->limit + length;
  }
  else {
    if (1 < leadCC) goto LAB_0028e0c0;
    pUVar4 = this->limit + 1;
  }
  this->reorderStart = pUVar4;
LAB_0028e0c0:
  pUVar4 = this->limit;
  lVar5 = 0;
  do {
    *(undefined2 *)((long)pUVar4 + lVar5) = *(undefined2 *)((long)s + lVar5);
    lVar5 = lVar5 + 2;
  } while ((long)length * 2 != lVar5);
  this->limit = (UChar *)((long)pUVar4 + lVar5);
  this->lastCC = trailCC;
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::append(const UChar *s, int32_t length, UBool isNFD,
                               uint8_t leadCC, uint8_t trailCC,
                               UErrorCode &errorCode) {
    if(length==0) {
        return TRUE;
    }
    if(remainingCapacity<length && !resize(length, errorCode)) {
        return FALSE;
    }
    remainingCapacity-=length;
    if(lastCC<=leadCC || leadCC==0) {
        if(trailCC<=1) {
            reorderStart=limit+length;
        } else if(leadCC<=1) {
            reorderStart=limit+1;  // Ok if not a code point boundary.
        }
        const UChar *sLimit=s+length;
        do { *limit++=*s++; } while(s!=sLimit);
        lastCC=trailCC;
    } else {
        int32_t i=0;
        UChar32 c;
        U16_NEXT(s, i, length, c);
        insert(c, leadCC);  // insert first code point
        while(i<length) {
            U16_NEXT(s, i, length, c);
            if(i<length) {
                if (isNFD) {
                    leadCC = Normalizer2Impl::getCCFromYesOrMaybe(impl.getRawNorm16(c));
                } else {
                    leadCC = impl.getCC(impl.getNorm16(c));
                }
            } else {
                leadCC=trailCC;
            }
            append(c, leadCC, errorCode);
        }
    }
    return TRUE;
}